

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

string * __thiscall
cmCMakePath::NativeString_abi_cxx11_(string *__return_storage_ptr__,cmCMakePath *this)

{
  cmCMakePath *this_local;
  string *path;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetNativePath(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string NativeString() const
  {
    std::string path;
    this->GetNativePath(path);

    return path;
  }